

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.hpp
# Opt level: O2

Result __thiscall
Kernel::LiteralOrdering<Kernel::LAKBO>::compare
          (LiteralOrdering<Kernel::LAKBO> *this,Literal *l1,Literal *l2)

{
  Result RVar1;
  _ElementType in_stack_00000220;
  _ElementType in_stack_00000238;
  Literal *l2_local;
  Literal *l1_local;
  LiteralOrdering<Kernel::LAKBO> *local_a8;
  Literal **ppLStack_a0;
  Literal **local_98;
  Option<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  *local_90;
  Option<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  *pOStack_88;
  LiteralOrdering<Kernel::LAKBO> *local_80;
  Option<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  atoms2;
  Option<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  atoms1;
  
  l2_local = l2;
  l1_local = l1;
  atoms(&atoms1,this,l1);
  atoms(&atoms2,this,l2);
  if (atoms1.
      super_OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
      ._isSome == false) {
    if (atoms2.
        super_OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
        ._isSome == false) {
      RVar1 = compareUninterpreted(this,l1,l2);
    }
    else {
      RVar1 = GREATER;
    }
  }
  else if (atoms2.
           super_OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
           ._isSome == false) {
    RVar1 = LESS;
  }
  else {
    ppLStack_a0 = &l1_local;
    local_98 = &l2_local;
    local_a8 = this;
    local_90 = &atoms1;
    pOStack_88 = &atoms2;
    local_80 = this;
    RVar1 = AlascaOrderingUtils::
            lexLazy<Kernel::LiteralOrdering<Kernel::LAKBO>::compare(Kernel::Literal*,Kernel::Literal*)const::_lambda()_1_,Kernel::LiteralOrdering<Kernel::LAKBO>::compare(Kernel::Literal*,Kernel::Literal*)const::_lambda()_2_>
                      (in_stack_00000220,in_stack_00000238);
  }
  Lib::
  OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  ::~OptionBase(&atoms2.
                 super_OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
               );
  Lib::
  OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  ::~OptionBase(&atoms1.
                 super_OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
               );
  return RVar1;
}

Assistant:

Result compare(Literal* l1, Literal* l2) const override {
    auto atoms1 = atoms(l1);
    auto atoms2 = atoms(l2);
    if (!atoms1.isSome() && atoms2.isSome()) {
      return Ordering::GREATER;

    } else if (atoms1.isSome() && !atoms2.isSome()) {
      return Ordering::LESS;

    } else if (atoms1.isSome() && atoms2.isSome()) {
      return AlascaOrderingUtils::lexLazy(
            [&](){ return OrderingUtils::mulExt(*atoms1, *atoms2, [&](auto l, auto r) { return cmpAtom(l, r); }); },
            [&](){ return cmpPrec(l1, l2); }
            );

    } else {
      ASS(atoms1.isNone() && atoms2.isNone())
      return compareUninterpreted(l1,l2);
    }
  }